

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-traversal.h
# Opt level: O1

void __thiscall
wasm::Visitor<wasm::BinaryenIRWriter<wasm::StackIRGenerator>,_void>::visit
          (Visitor<wasm::BinaryenIRWriter<wasm::StackIRGenerator>,_void> *this,Expression *curr)

{
  if (curr != (Expression *)0x0) {
    switch(curr->_id) {
    case BlockId:
      BinaryenIRWriter<wasm::StackIRGenerator>::visitBlock
                ((BinaryenIRWriter<wasm::StackIRGenerator> *)this,(Block *)curr);
      return;
    case IfId:
      BinaryenIRWriter<wasm::StackIRGenerator>::visitIf
                ((BinaryenIRWriter<wasm::StackIRGenerator> *)this,(If *)curr);
      return;
    case LoopId:
      BinaryenIRWriter<wasm::StackIRGenerator>::visitLoop
                ((BinaryenIRWriter<wasm::StackIRGenerator> *)this,(Loop *)curr);
      return;
    case BreakId:
    case SwitchId:
    case CallId:
    case CallIndirectId:
    case LocalGetId:
    case LocalSetId:
    case GlobalGetId:
    case GlobalSetId:
    case LoadId:
    case StoreId:
    case ConstId:
    case UnaryId:
    case BinaryId:
    case SelectId:
    case DropId:
    case ReturnId:
    case MemorySizeId:
    case MemoryGrowId:
    case NopId:
    case UnreachableId:
    case AtomicRMWId:
    case AtomicCmpxchgId:
    case AtomicWaitId:
    case AtomicNotifyId:
    case AtomicFenceId:
    case SIMDExtractId:
    case SIMDReplaceId:
    case SIMDShuffleId:
    case SIMDTernaryId:
    case SIMDShiftId:
    case SIMDLoadId:
    case SIMDLoadStoreLaneId:
    case MemoryInitId:
    case DataDropId:
    case MemoryCopyId:
    case MemoryFillId:
    case PopId:
    case RefNullId:
    case RefIsNullId:
    case RefFuncId:
    case RefEqId:
    case TableGetId:
    case TableSetId:
    case TableSizeId:
    case TableGrowId:
    case TableFillId:
    case TableCopyId:
    case TableInitId:
    case ThrowId:
    case RethrowId:
    case ThrowRefId:
    case TupleMakeId:
    case TupleExtractId:
    case RefI31Id:
    case I31GetId:
    case CallRefId:
    case RefTestId:
    case RefCastId:
    case BrOnId:
    case StructNewId:
    case StructGetId:
    case StructSetId:
    case StructRMWId:
    case StructCmpxchgId:
    case ArrayNewId:
    case ArrayNewDataId:
    case ArrayNewElemId:
    case ArrayNewFixedId:
    case ArrayGetId:
    case ArraySetId:
    case ArrayLenId:
    case ArrayCopyId:
    case ArrayFillId:
    case ArrayInitDataId:
    case ArrayInitElemId:
    case RefAsId:
    case StringNewId:
    case StringConstId:
    case StringMeasureId:
    case StringEncodeId:
    case StringConcatId:
    case StringEqId:
    case StringWTF16GetId:
    case StringSliceWTFId:
    case ContNewId:
    case ContBindId:
    case SuspendId:
    case ResumeId:
    case ResumeThrowId:
    case StackSwitchId:
      return;
    case TryId:
      BinaryenIRWriter<wasm::StackIRGenerator>::visitTry
                ((BinaryenIRWriter<wasm::StackIRGenerator> *)this,(Try *)curr);
      return;
    case TryTableId:
      BinaryenIRWriter<wasm::StackIRGenerator>::visitTryTable
                ((BinaryenIRWriter<wasm::StackIRGenerator> *)this,(TryTable *)curr);
      return;
    default:
      handle_unreachable("unexpected expression type",
                         "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-traversal.h"
                         ,0x46);
    }
  }
  __assert_fail("curr",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-traversal.h"
                ,0x3b,
                "ReturnType wasm::Visitor<wasm::BinaryenIRWriter<wasm::StackIRGenerator>>::visit(Expression *) [SubType = wasm::BinaryenIRWriter<wasm::StackIRGenerator>, ReturnType = void]"
               );
}

Assistant:

ReturnType visit(Expression* curr) {
    assert(curr);

    switch (curr->_id) {
#define DELEGATE(CLASS_TO_VISIT)                                               \
  case Expression::Id::CLASS_TO_VISIT##Id:                                     \
    return static_cast<SubType*>(this)->visit##CLASS_TO_VISIT(                 \
      static_cast<CLASS_TO_VISIT*>(curr))

#include "wasm-delegations.def"

      default:
        WASM_UNREACHABLE("unexpected expression type");
    }
  }